

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

size_t __thiscall fmt::v11::detail::code_point_index(detail *this,string_view s,size_t n)

{
  anon_class_24_3_b33ccaaf_for_f f;
  string_view s_00;
  size_t result;
  char *local_18;
  size_t local_10;
  
  local_10 = s.size_;
  s_00.size_ = s.data_;
  f.n = &local_10;
  f.begin = (char *)this;
  f.result = (size_t *)&local_18;
  s_00.data_ = (char *)this;
  local_18 = s_00.size_;
  for_each_codepoint<fmt::v11::detail::code_point_index(fmt::v11::basic_string_view<char>,unsigned_long)::_lambda(unsigned_int,fmt::v11::basic_string_view<char>)_1_>
            (s_00,f);
  return (size_t)local_18;
}

Assistant:

inline auto code_point_index(string_view s, size_t n) -> size_t {
  size_t result = s.size();
  const char* begin = s.begin();
  for_each_codepoint(s, [begin, &n, &result](uint32_t, string_view sv) {
    if (n != 0) {
      --n;
      return true;
    }
    result = to_unsigned(sv.begin() - begin);
    return false;
  });
  return result;
}